

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int x25519_create_key_exchange(ptls_key_exchange_context_t **_ctx,ptls_iovec_t *pubkey)

{
  int iVar1;
  ptls_key_exchange_context_t *ppVar2;
  
  ppVar2 = (ptls_key_exchange_context_t *)malloc(0x48);
  if (ppVar2 == (ptls_key_exchange_context_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    ppVar2->on_exchange = x25519_on_exchange;
    x25519_create_keypair((uint8_t *)(ppVar2 + 1),(uint8_t *)(ppVar2 + 5));
    *_ctx = ppVar2;
    pubkey->base = (uint8_t *)(ppVar2 + 5);
    pubkey->len = 0x20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int x25519_create_key_exchange(ptls_key_exchange_context_t **_ctx, ptls_iovec_t *pubkey)
{
    struct st_x25519_key_exchange_t *ctx;

    if ((ctx = (struct st_x25519_key_exchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){x25519_on_exchange};
    x25519_create_keypair(ctx->priv, ctx->pub);

    *_ctx = &ctx->super;
    *pubkey = ptls_iovec_init(ctx->pub, sizeof(ctx->pub));
    return 0;
}